

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

String * __thiscall
nigel::Token_NumberL::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_NumberL *this,bool extended)

{
  undefined7 in_register_00000011;
  char *__rhs;
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,this->number);
  __rhs = "";
  if ((int)CONCAT71(in_register_00000011,extended) != 0) {
    __rhs = "\t\tas number literal";
  }
  std::operator+(__return_storage_ptr__,&sStack_38,__rhs);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

String Token_NumberL::toString( bool extended ) const
	{
		return to_string( number ) + ( extended ? "\t\tas number literal" : "" );
	}